

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

Maybe<capnp::_::RawSchema_*const_&> __thiscall
kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long&>
          (HashMap<unsigned_long,capnp::_::RawSchema*> *this,unsigned_long *key)

{
  Maybe<capnp::_::RawSchema_*const_&> MVar1;
  long lVar2;
  ArrayPtr<const_kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> table;
  HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks> local_20 [8];
  long local_18;
  
  table.size_ = *(size_t *)this;
  table.ptr = (Entry *)(this + 0x20);
  HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>::
  find<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry_const,unsigned_long&>
            (local_20,table,(unsigned_long *)((long)(*(long *)(this + 8) - *(size_t *)this) >> 4));
  lVar2 = 0;
  if (local_20[0] != (HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>)0x0) {
    lVar2 = local_18 * 0x10 + *(long *)this;
  }
  MVar1.ptr = (RawSchema **)(lVar2 + 8);
  if (lVar2 == 0) {
    MVar1.ptr = (RawSchema **)0x0;
  }
  return (Maybe<capnp::_::RawSchema_*const_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<const Value&> HashMap<Key, Value>::find(KeyLike&& key) const {
  return table.find(key).map([](const Entry& e) -> const Value& { return e.value; });
}